

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall helics::CommonCore::processDisconnectCommand(CommonCore *this,ActionMessage *cmd)

{
  value_t vVar1;
  BrokerState BVar2;
  action_t aVar3;
  GlobalFederateId federateID;
  pthread_t pVar4;
  FilterFederate *this_00;
  TranslatorFederate *this_01;
  pointer pcVar5;
  size_type sVar6;
  BaseTimeCoordinator *pBVar7;
  json_value jVar8;
  FederateState *this_02;
  string_view message;
  string_view message_00;
  bool bVar9;
  OperatingState OVar10;
  FederateStates FVar11;
  int iVar12;
  uint uVar13;
  pthread_t pVar14;
  string_view *psVar15;
  string *val;
  reference pvVar16;
  long lVar17;
  char *pcVar18;
  int iVar19;
  FedInfo **ppFVar20;
  uint uVar21;
  FedInfo **ppFVar22;
  BrokerBase *this_03;
  ulong uVar23;
  FedInfo *pFVar24;
  FedInfo **ppFVar25;
  string_view queryStr;
  string_view queryStr_00;
  string_view name;
  string_view name_00;
  string_view queryStr_01;
  string_view name_01;
  string_view jsonString;
  string_view jsonString_00;
  string_view jsonString_01;
  json element;
  BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> fed;
  json base;
  data local_240;
  ActionMessage *local_230;
  FedInfo **local_228;
  undefined1 local_220 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210 [10];
  BrokerBase *local_168;
  CommonCore *local_160;
  data local_158;
  undefined8 local_148;
  char *pcStack_140;
  FedInfo **ppFStack_130;
  data local_128;
  data local_118;
  undefined1 local_108 [184];
  string_view local_50;
  string_view local_40;
  
  aVar3 = cmd->messageAction;
  if (aVar3 < cmd_stop) {
    switch(aVar3) {
    case cmd_user_disconnect:
switchD_003052ce_caseD_2:
      BVar2 = (this->super_BrokerBase).brokerState._M_i;
      if ((ushort)((this->super_BrokerBase).brokerState._M_i + CONNECTED_ERROR) < 7) {
        if (BVar2 < TERMINATING) {
          BrokerBase::setBrokerState(&this->super_BrokerBase,TERMINATING);
LAB_00305442:
          sendDisconnect(this,cmd_stop);
        }
      }
      else if (BVar2 == ERRORED) goto LAB_00305442;
      ActionMessage::ActionMessage((ActionMessage *)local_220,cmd_stop);
      BrokerBase::addActionMessage(&this->super_BrokerBase,(ActionMessage *)local_220);
      goto LAB_00305d51;
    case cmd_disconnect:
    case cmd_disconnect_fed:
      if ((cmd->dest_id).gid != 0) {
        routeMessage(this,cmd);
        return;
      }
      if ((this->super_BrokerBase).brokerState._M_i < TERMINATING) {
        gmlc::containers::
        DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
        ::find((BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> *)local_220,
               &this->loopFederates,&cmd->source_id);
        iVar12 = (this->loopFederates).dataStorage.bsize;
        ppFVar25 = (this->loopFederates).dataStorage.dataptr;
        lVar17 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
        if (ppFVar25 == (FedInfo **)0x0) {
          ppFVar22 = &gmlc::containers::
                      StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end
                      ::emptyValue;
        }
        else {
          ppFVar22 = ppFVar25 + lVar17 + 1;
        }
        ppFVar25 = ppFVar25 + lVar17;
        if (iVar12 == 0x20) {
          ppFVar25 = ppFVar22;
          iVar12 = 0;
        }
        if (ppFVar25 == (FedInfo **)local_220._0_8_) {
          if (iVar12 == (undefined4)local_210[0]._M_allocated_capacity) {
            return;
          }
        }
        else if (((((FedInfo **)local_220._0_8_ != (FedInfo **)0x0) && (ppFVar25 != (FedInfo **)0x0)
                  ) && (*(FedInfo **)local_220._0_8_ == (FedInfo *)0x0)) &&
                (*ppFVar25 == (FedInfo *)0x0 &&
                 iVar12 == (undefined4)local_210[0]._M_allocated_capacity)) {
          return;
        }
        *(undefined1 *)(CONCAT44(local_220._12_4_,local_220._8_4_) + 8) = 10;
        BVar2 = (this->super_BrokerBase).brokerState._M_i;
        bVar9 = checkAndProcessDisconnect(this);
        if (BVar2 < OPERATING || !bVar9) {
          ActionMessage::setAction(cmd,cmd_disconnect_fed);
          (*(this->super_Core)._vptr_Core[0x6b])(this,0,cmd);
          OVar10 = minFederateState(this);
          if ((((OVar10 != DISCONNECTED) || (this->filterFed != (FilterFederate *)0x0)) ||
              (this->translatorFed != (TranslatorFederate *)0x0)) &&
             ((this->super_BrokerBase).globalDisconnect == false)) {
            ActionMessage::setAction(cmd,cmd_disconnect_fed_ack);
            (cmd->dest_id).gid = (cmd->source_id).gid;
            (cmd->source_id).gid = 0;
            routeMessage(this,cmd);
          }
        }
      }
      break;
    case cmd_disconnect_check:
      goto LAB_00305684;
    case cmd_broadcast_disconnect:
      pBVar7 = (this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
      (*pBVar7->_vptr_BaseTimeCoordinator[3])(pBVar7,cmd);
      if ((this->loopFederates).dataStorage.csize == 0) {
        uVar23 = (ulong)(this->loopFederates).dataStorage.bsize;
        ppFVar25 = (this->loopFederates).dataStorage.dataptr;
        if (uVar23 == 0x20) {
          if (ppFVar25 == (FedInfo **)0x0) {
            ppFVar25 = &gmlc::containers::
                        StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::
                        end::emptyValue;
          }
          else {
            ppFVar25 = ppFVar25 + (long)(this->loopFederates).dataStorage.dataSlotIndex + 1;
          }
          goto LAB_003053fd;
        }
        ppFVar25 = ppFVar25 + (this->loopFederates).dataStorage.dataSlotIndex;
        pFVar24 = *ppFVar25 + uVar23;
      }
      else {
        ppFVar25 = (this->loopFederates).dataStorage.dataptr;
LAB_003053fd:
        pFVar24 = *ppFVar25;
        uVar23 = 0;
      }
      iVar12 = (this->loopFederates).dataStorage.bsize;
      ppFVar22 = (this->loopFederates).dataStorage.dataptr;
      lVar17 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
      if (ppFVar22 == (FedInfo **)0x0) {
        ppFVar20 = &gmlc::containers::
                    StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end::
                    emptyValue;
      }
      else {
        ppFVar20 = ppFVar22 + lVar17 + 1;
      }
      iVar19 = 0;
      if (iVar12 != 0x20) {
        iVar19 = iVar12;
      }
      ppFVar22 = ppFVar22 + lVar17;
      local_160 = this;
      if (iVar12 == 0x20) {
        ppFVar22 = ppFVar20;
      }
      while ((iVar12 = (int)uVar23, iVar12 != iVar19 || (this = local_160, ppFVar25 != ppFVar22))) {
        FederateState::addAction(pFVar24->fed,cmd);
        uVar13 = iVar12 + 1;
        if (iVar12 < 0x1f) {
          pFVar24 = pFVar24 + 1;
        }
        else {
          ppFVar25 = ppFVar25 + (ulong)(iVar12 - 0x1fU >> 5) + 1;
          uVar13 = uVar13 & 0x1f;
          pFVar24 = (FedInfo *)((long)&(*ppFVar25)->fed + (ulong)(uVar13 << 4));
        }
        uVar23 = (ulong)uVar13;
      }
LAB_00305684:
      checkAndProcessDisconnect(this);
      return;
    }
  }
  else {
    if (aVar3 < cmd_timeout_disconnect) {
      if (aVar3 == cmd_stop) {
        if (((ushort)((this->super_BrokerBase).brokerState._M_i + CONNECTED_ERROR) < 7) &&
           ((this->super_BrokerBase).brokerState._M_i < TERMINATING)) {
          BrokerBase::setBrokerState(&this->super_BrokerBase,TERMINATING);
          sendDisconnect(this,cmd_stop);
        }
        pVar4 = (this->filterThread)._M_i._M_thread;
        pVar14 = pthread_self();
        if ((pVar4 == pVar14) && (this_00 = this->filterFed, this_00 != (FilterFederate *)0x0)) {
          FilterFederate::~FilterFederate(this_00);
          operator_delete(this_00,0x4c0);
          this->filterFed = (FilterFederate *)0x0;
          LOCK();
          (this->filterThread)._M_i._M_thread = 0;
          UNLOCK();
        }
        if (((this->translatorThread)._M_i._M_thread == pVar14) &&
           (this_01 = this->translatorFed, this_01 != (TranslatorFederate *)0x0)) {
          TranslatorFederate::~TranslatorFederate(this_01);
          operator_delete(this_01,0x3d8);
          this->translatorFed = (TranslatorFederate *)0x0;
          LOCK();
          (this->translatorThread)._M_i._M_thread = 0;
          UNLOCK();
        }
        local_220._0_8_ = local_220 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"#disconnected","");
        gmlc::concurrency::
        DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::fulfillAllPromises
                  (&this->activeQueries,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220);
        if ((undefined1 *)local_220._0_8_ == local_220 + 0x10) {
          return;
        }
        operator_delete((void *)local_220._0_8_,
                        CONCAT44(local_210[0]._M_allocated_capacity._4_4_,
                                 (undefined4)local_210[0]._M_allocated_capacity) + 1);
        return;
      }
      if (aVar3 != cmd_global_disconnect) {
        return;
      }
      goto switchD_003052ce_caseD_2;
    }
    if (aVar3 == cmd_timeout_disconnect) {
      if ((ushort)((this->super_BrokerBase).brokerState._M_i + CONNECTED_ERROR) < 7) {
        this_03 = &this->super_BrokerBase;
        federateID.gid = (this->super_BrokerBase).global_broker_id_local.gid;
        pcVar5 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        sVar6 = (this->super_BrokerBase).identifier._M_string_length;
        if ((cmd->source_id).gid == federateID.gid) {
          psVar15 = &local_50;
          local_50._M_len = 0x12;
          pcVar18 = "timeout disconnect";
        }
        else {
          psVar15 = &local_40;
          local_40._M_len = 0x1b;
          pcVar18 = "received timeout disconnect";
        }
        psVar15->_M_str = pcVar18;
        name_00._M_str = pcVar5;
        name_00._M_len = sVar6;
        BrokerBase::sendToLogger(this_03,federateID,0,name_00,*psVar15,false);
        pBVar7 = (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
        if ((pBVar7 != (BaseTimeCoordinator *)0x0) &&
           (*(pointer *)
             &(pBVar7->dependencies).dependencies.
              super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> !=
            (pBVar7->dependencies).dependencies.
            super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish)) {
          local_108[0] = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          )0x0;
          local_108._8_8_ = (object_t *)0x0;
          BrokerBase::addBaseInformation(this_03,(json *)local_108,true);
          val = brokerStateName_abi_cxx11_((this->super_BrokerBase).brokerState._M_i);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_118,val);
          pvVar16 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)local_108,"state");
          vVar1 = (pvVar16->m_data).m_type;
          (pvVar16->m_data).m_type = local_118.m_type;
          jVar8 = (pvVar16->m_data).m_value;
          (pvVar16->m_data).m_value = local_118.m_value;
          local_118.m_type = vVar1;
          local_118.m_value = jVar8;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_118);
          local_158.m_type = null;
          local_158.m_value.object = (object_t *)0x0;
          pvVar16 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)local_108,"time");
          vVar1 = (pvVar16->m_data).m_type;
          (pvVar16->m_data).m_type = local_158.m_type;
          jVar8 = (pvVar16->m_data).m_value;
          (pvVar16->m_data).m_value.object = (object_t *)local_158.m_value;
          local_158.m_type = vVar1;
          local_158.m_value = jVar8;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_158);
          pBVar7 = (this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::operator[]<char_const>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      *)local_108,"time");
          (*pBVar7->_vptr_BaseTimeCoordinator[0xc])(pBVar7);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_128,(initializer_list_t)ZEXT816(0),false,array);
          pvVar16 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)local_108,"federates");
          vVar1 = (pvVar16->m_data).m_type;
          (pvVar16->m_data).m_type = local_128.m_type;
          jVar8 = (pvVar16->m_data).m_value;
          (pvVar16->m_data).m_value = local_128.m_value;
          local_128.m_type = vVar1;
          local_128.m_value = jVar8;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_128);
          if ((this->loopFederates).dataStorage.csize == 0) {
            uVar23 = (ulong)(this->loopFederates).dataStorage.bsize;
            ppFVar25 = (this->loopFederates).dataStorage.dataptr;
            if (uVar23 == 0x20) {
              if (ppFVar25 == (FedInfo **)0x0) {
                ppFVar25 = &gmlc::containers::
                            StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>
                            ::end::emptyValue;
              }
              else {
                ppFVar25 = ppFVar25 + (long)(this->loopFederates).dataStorage.dataSlotIndex + 1;
              }
              goto LAB_003058c9;
            }
            ppFVar25 = ppFVar25 + (this->loopFederates).dataStorage.dataSlotIndex;
            pFVar24 = *ppFVar25 + uVar23;
          }
          else {
            ppFVar25 = (this->loopFederates).dataStorage.dataptr;
LAB_003058c9:
            pFVar24 = *ppFVar25;
            uVar23 = 0;
          }
          uVar13 = (this->loopFederates).dataStorage.bsize;
          ppFVar22 = (this->loopFederates).dataStorage.dataptr;
          lVar17 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
          if (ppFVar22 == (FedInfo **)0x0) {
            ppFVar20 = &gmlc::containers::
                        StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::
                        end::emptyValue;
          }
          else {
            ppFVar20 = ppFVar22 + lVar17 + 1;
          }
          local_228 = ppFVar22 + lVar17;
          if (uVar13 == 0x20) {
            local_228 = ppFVar20;
          }
          uVar21 = 0;
          if (uVar13 != 0x20) {
            uVar21 = uVar13;
          }
          local_230 = cmd;
          local_168 = this_03;
          if (((uint)uVar23 != uVar21) || (ppFVar25 != local_228)) {
            do {
              queryStr_01._M_str = "global_time_debugging";
              queryStr_01._M_len = 0x15;
              federateQuery_abi_cxx11_((string *)local_220,this,pFVar24->fed,queryStr_01,false);
              iVar12 = CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_220,"#wait");
              if (iVar12 == 0) {
                FVar11 = FederateState::getState(pFVar24->fed);
                if (FVar11 < TERMINATING) {
                  (local_230->dest_id).gid = (pFVar24->fed->global_id)._M_i.gid;
                  (local_230->source_id).gid = (this->super_BrokerBase).global_broker_id_local.gid;
                  FederateState::addAction(pFVar24->fed,local_230);
                }
              }
              else {
                jsonString._M_str._4_4_ = local_220._12_4_;
                jsonString._M_str._0_4_ = local_220._8_4_;
                jsonString._M_len = (size_t)&local_240;
                fileops::loadJsonStr_abi_cxx11_(jsonString);
                pvVar16 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                      *)local_108,"federates");
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::push_back(pvVar16,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                     *)&local_240);
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::data::~data(&local_240);
              }
              if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
                operator_delete((void *)local_220._0_8_,
                                CONCAT44(local_210[0]._M_allocated_capacity._4_4_,
                                         (undefined4)local_210[0]._M_allocated_capacity) + 1);
              }
              iVar12 = (int)uVar23;
              uVar13 = iVar12 + 1;
              if (iVar12 < 0x1f) {
                pFVar24 = pFVar24 + 1;
              }
              else {
                ppFVar25 = ppFVar25 + (ulong)(iVar12 - 0x1fU >> 5) + 1;
                uVar13 = uVar13 & 0x1f;
                pFVar24 = (FedInfo *)((long)&(*ppFVar25)->fed + (ulong)(uVar13 << 4));
              }
              uVar23 = (ulong)uVar13;
            } while ((uVar13 != uVar21) || (ppFVar25 != local_228));
          }
          this_03 = local_168;
          cmd = local_230;
          if (this->filterFed != (FilterFederate *)0x0) {
            queryStr._M_str = "global_time_debugging";
            queryStr._M_len = 0x15;
            FilterFederate::query_abi_cxx11_((string *)local_220,this->filterFed,queryStr);
            jsonString_00._M_str._4_4_ = local_220._12_4_;
            jsonString_00._M_str._0_4_ = local_220._8_4_;
            jsonString_00._M_len = (size_t)&local_240;
            fileops::loadJsonStr_abi_cxx11_(jsonString_00);
            pvVar16 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                  *)local_108,"federates");
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::push_back(pvVar16,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)&local_240);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_240);
            if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
              operator_delete((void *)local_220._0_8_,
                              CONCAT44(local_210[0]._M_allocated_capacity._4_4_,
                                       (undefined4)local_210[0]._M_allocated_capacity) + 1);
            }
          }
          if (this->translatorFed != (TranslatorFederate *)0x0) {
            queryStr_00._M_str = "global_time_debugging";
            queryStr_00._M_len = 0x15;
            TranslatorFederate::query_abi_cxx11_
                      ((string *)local_220,this->translatorFed,queryStr_00);
            jsonString_01._M_str._4_4_ = local_220._12_4_;
            jsonString_01._M_str._0_4_ = local_220._8_4_;
            jsonString_01._M_len = (size_t)&local_240;
            fileops::loadJsonStr_abi_cxx11_(jsonString_01);
            pvVar16 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                  *)local_108,"federates");
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::push_back(pvVar16,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)&local_240);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_240);
            if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
              operator_delete((void *)local_220._0_8_,
                              CONCAT44(local_210[0]._M_allocated_capacity._4_4_,
                                       (undefined4)local_210[0]._M_allocated_capacity) + 1);
            }
          }
          fileops::generateJsonString((string *)local_220,(json *)local_108,true);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220,
                     0,"TIME DEBUGGING::");
          message_00._M_len._4_4_ = local_220._12_4_;
          message_00._M_len._0_4_ = local_220._8_4_;
          ppFStack_130 = (FedInfo **)local_220._0_8_;
          message_00._M_str = (char *)local_220._0_8_;
          name_01._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
          name_01._M_len = (this->super_BrokerBase).identifier._M_string_length;
          BrokerBase::sendToLogger
                    (this_03,(GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,3
                     ,name_01,message_00,false);
          if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
            operator_delete((void *)local_220._0_8_,
                            CONCAT44(local_210[0]._M_allocated_capacity._4_4_,
                                     (undefined4)local_210[0]._M_allocated_capacity) + 1);
          }
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)local_108);
        }
        if ((this->super_BrokerBase).brokerState._M_i < TERMINATING) {
          BrokerBase::setBrokerState(this_03,TERMINATING);
          (cmd->source_id).gid = (this->super_BrokerBase).global_broker_id_local.gid;
          broadcastToFederates(this,cmd);
LAB_00305d23:
          sendDisconnect(this,cmd_stop);
        }
      }
      else if ((this->super_BrokerBase).brokerState._M_i == ERRORED) {
        local_148 = 0x2a;
        pcStack_140 = "received timeout disconnect in error state";
        message._M_str = "received timeout disconnect in error state";
        message._M_len = 0x2a;
        name._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        name._M_len = (this->super_BrokerBase).identifier._M_string_length;
        BrokerBase::sendToLogger
                  (&this->super_BrokerBase,
                   (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,0,name,
                   message,false);
        goto LAB_00305d23;
      }
      ActionMessage::ActionMessage((ActionMessage *)local_220,cmd_stop);
      BrokerBase::addActionMessage(&this->super_BrokerBase,(ActionMessage *)local_220);
      goto LAB_00305d51;
    }
    if (aVar3 != cmd_disconnect_core_ack) {
      return;
    }
    if ((cmd->dest_id).gid != (this->super_BrokerBase).global_broker_id_local.gid) {
      return;
    }
    if ((cmd->source_id).gid != (this->super_BrokerBase).higher_broker_id.gid) {
      return;
    }
    ActionMessage::ActionMessage((ActionMessage *)local_220,cmd_disconnect_fed_ack);
    local_220._8_4_ = 0;
    if ((this->loopFederates).dataStorage.csize == 0) {
      uVar23 = (ulong)(this->loopFederates).dataStorage.bsize;
      ppFVar25 = (this->loopFederates).dataStorage.dataptr;
      if (uVar23 == 0x20) {
        if (ppFVar25 == (FedInfo **)0x0) {
          ppFVar25 = &gmlc::containers::
                      StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end
                      ::emptyValue;
        }
        else {
          ppFVar25 = ppFVar25 + (long)(this->loopFederates).dataStorage.dataSlotIndex + 1;
        }
        goto LAB_003053a9;
      }
      ppFVar25 = ppFVar25 + (this->loopFederates).dataStorage.dataSlotIndex;
      pFVar24 = *ppFVar25 + uVar23;
    }
    else {
      ppFVar25 = (this->loopFederates).dataStorage.dataptr;
LAB_003053a9:
      pFVar24 = *ppFVar25;
      uVar23 = 0;
    }
    uVar13 = (this->loopFederates).dataStorage.bsize;
    ppFVar22 = (this->loopFederates).dataStorage.dataptr;
    lVar17 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
    if (ppFVar22 == (FedInfo **)0x0) {
      ppFVar20 = &gmlc::containers::
                  StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end::
                  emptyValue;
    }
    else {
      ppFVar20 = ppFVar22 + lVar17 + 1;
    }
    uVar21 = 0;
    if (uVar13 != 0x20) {
      uVar21 = uVar13;
    }
    ppFVar22 = ppFVar22 + lVar17;
    if (uVar13 == 0x20) {
      ppFVar22 = ppFVar20;
    }
    if ((uint)uVar23 == uVar21) goto LAB_00305f06;
    do {
      do {
        this_02 = pFVar24->fed;
        FVar11 = FederateState::getState(this_02);
        if (FVar11 != FINISHED) {
          local_210[0]._0_4_ = (this_02->global_id)._M_i.gid;
          FederateState::addAction(this_02,(ActionMessage *)local_220);
        }
        iVar12 = (int)uVar23;
        uVar13 = iVar12 + 1;
        if (iVar12 < 0x1f) {
          pFVar24 = pFVar24 + 1;
        }
        else {
          ppFVar25 = ppFVar25 + (ulong)(iVar12 - 0x1fU >> 5) + 1;
          uVar13 = uVar13 & 0x1f;
          pFVar24 = (FedInfo *)((long)&(*ppFVar25)->fed + (ulong)(uVar13 << 4));
        }
        uVar23 = (ulong)uVar13;
      } while (uVar13 != uVar21);
LAB_00305f06:
    } while (ppFVar25 != ppFVar22);
    ActionMessage::ActionMessage((ActionMessage *)local_108,cmd_stop);
    BrokerBase::addActionMessage(&this->super_BrokerBase,(ActionMessage *)local_108);
    ActionMessage::~ActionMessage((ActionMessage *)local_108);
LAB_00305d51:
    ActionMessage::~ActionMessage((ActionMessage *)local_220);
  }
  return;
}

Assistant:

void CommonCore::processDisconnectCommand(ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_USER_DISCONNECT:
        case CMD_GLOBAL_DISCONNECT:
            if (isConnected()) {
                if (getBrokerState() <
                    BrokerState::TERMINATING) {  // only send a disconnect message
                                                 // if we haven't done so already
                    setBrokerState(BrokerState::TERMINATING);
                    sendDisconnect();
                }
            } else if (getBrokerState() ==
                       BrokerState::ERRORED) {  // we are disconnecting in an error state
                sendDisconnect();
            }
            addActionMessage(CMD_STOP);
            // we can't just fall through since this may have generated other messages that need to
            // be forwarded or processed
            break;
        case CMD_BROADCAST_DISCONNECT:
            timeCoord->processTimeMessage(cmd);
            loopFederates.apply([&cmd](auto& fed) { fed->addAction(cmd); });
            checkAndProcessDisconnect();
            break;
        case CMD_TIMEOUT_DISCONNECT:
            if (isConnected()) {
                if (cmd.source_id != global_broker_id_local) {
                    LOG_ERROR(global_broker_id_local,
                              getIdentifier(),
                              "received timeout disconnect");
                } else {
                    LOG_ERROR(global_broker_id_local, getIdentifier(), "timeout disconnect");
                }
                if (timeCoord && !timeCoord->empty()) {
                    nlohmann::json base;
                    addBaseInformation(base, true);
                    base["state"] = brokerStateName(getBrokerState());
                    base["time"] = nlohmann::json();
                    timeCoord->generateDebuggingTimeInfo(base["time"]);
                    base["federates"] = nlohmann::json::array();
                    for (const auto& fed : loopFederates) {
                        const std::string ret =
                            federateQuery(fed.fed, "global_time_debugging", false);
                        if (ret == "#wait") {
                            if (fed->getState() <= FederateStates::EXECUTING) {
                                cmd.dest_id = fed->global_id.load();
                                cmd.source_id = global_broker_id_local;
                                fed.fed->addAction(cmd);
                            }
                        } else {
                            auto element = fileops::loadJsonStr(ret);
                            base["federates"].push_back(element);
                        }
                    }
                    if (filterFed != nullptr) {
                        auto str = filterFed->query("global_time_debugging");
                        auto element = fileops::loadJsonStr(str);
                        base["federates"].push_back(element);
                    }
                    if (translatorFed != nullptr) {
                        auto str = translatorFed->query("global_time_debugging");
                        auto element = fileops::loadJsonStr(str);
                        base["federates"].push_back(element);
                    }
                    auto debugString = fileops::generateJsonString(base);
                    debugString.insert(0, "TIME DEBUGGING::");
                    LOG_WARNING(global_broker_id_local, identifier, debugString);
                }

                if (getBrokerState() < BrokerState::TERMINATING) {
                    // only send a disconnect message
                    // if we haven't done so already
                    setBrokerState(BrokerState::TERMINATING);
                    cmd.source_id = global_broker_id_local;
                    broadcastToFederates(cmd);
                    sendDisconnect();
                }
            } else if (getBrokerState() == BrokerState::ERRORED) {
                // we are disconnecting in an error state
                LOG_ERROR(global_broker_id_local,
                          getIdentifier(),
                          "received timeout disconnect in error state");
                sendDisconnect();
            }
            addActionMessage(CMD_STOP);
            break;
        case CMD_STOP:

            if (isConnected()) {
                if (getBrokerState() <
                    BrokerState::TERMINATING) {  // only send a disconnect message
                                                 // if we haven't done so already
                    setBrokerState(BrokerState::TERMINATING);
                    sendDisconnect();
                }
            }
            if (filterThread.load() == std::this_thread::get_id()) {
                if (filterFed != nullptr) {
                    delete filterFed;
                    filterFed = nullptr;
                    filterThread.store(std::thread::id{});
                }
            }
            if (translatorThread.load() == std::this_thread::get_id()) {
                if (translatorFed != nullptr) {
                    delete translatorFed;
                    translatorFed = nullptr;
                    translatorThread.store(std::thread::id{});
                }
            }
            activeQueries.fulfillAllPromises("#disconnected");
            break;
        case CMD_DISCONNECT:
        case CMD_DISCONNECT_FED:
            if (cmd.dest_id == parent_broker_id) {
                if (getBrokerState() < BrokerState::TERMINATING) {
                    auto fed = loopFederates.find(cmd.source_id);
                    if (fed == loopFederates.end()) {
                        return;
                    }
                    fed->state = OperatingState::DISCONNECTED;
                    auto cstate = getBrokerState();
                    if ((!checkAndProcessDisconnect()) || (cstate < BrokerState::OPERATING)) {
                        cmd.setAction(CMD_DISCONNECT_FED);
                        transmit(parent_route_id, cmd);
                        if ((minFederateState() != OperatingState::DISCONNECTED ||
                             filterFed != nullptr || translatorFed != nullptr) &&
                            !globalDisconnect) {
                            cmd.setAction(CMD_DISCONNECT_FED_ACK);
                            cmd.dest_id = cmd.source_id;
                            cmd.source_id = parent_broker_id;
                            routeMessage(cmd);
                        }
                    }
                }
            } else {
                routeMessage(cmd);
            }

            break;
        case CMD_DISCONNECT_CHECK:
            checkAndProcessDisconnect();
            break;
        case CMD_DISCONNECT_CORE_ACK:
            if ((cmd.dest_id == global_broker_id_local) && (cmd.source_id == higher_broker_id)) {
                ActionMessage bye(CMD_DISCONNECT_FED_ACK);
                bye.source_id = parent_broker_id;
                for (auto fed : loopFederates) {
                    if (fed->getState() != FederateStates::FINISHED) {
                        bye.dest_id = fed->global_id.load();
                        fed->addAction(bye);
                    }
                }
                addActionMessage(CMD_STOP);
            }
            break;
        default:
            break;
    }
}